

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

bool __thiscall
axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::
setCountImpl<axl::sl::SimpleArrayDetails<unsigned_long>::ZeroConstruct>
          (Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this,size_t count)

{
  ulong uVar1;
  size_t sVar2;
  BufHdr *pBVar3;
  BufHdr *pBVar4;
  ulong in_RSI;
  BufHdr *in_RDI;
  unsigned_long *p;
  Ptr<axl::rc::BufHdr> hdr;
  size_t bufferSize;
  bool result;
  size_t size;
  unsigned_long *in_stack_ffffffffffffff88;
  RefCount **in_stack_ffffffffffffff98;
  BufHdr *in_stack_ffffffffffffffa0;
  Ptr local_40 [16];
  size_t local_30;
  undefined1 local_22;
  ulong local_20;
  ulong local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar5;
  
  local_20 = in_RSI << 3;
  local_18 = in_RSI;
  pBVar3 = in_RDI;
  if (((Hdr *)(in_RDI->super_RefCount).m_freeFunc != (Hdr *)0x0) &&
     (sVar2 = rc::RefCount::getRefCount((RefCount *)(in_RDI->super_RefCount).m_freeFunc), sVar2 == 1
     )) {
    if (*(size_t *)&(in_RDI->super_RefCount).m_refCount == local_18) {
      bVar5 = 1;
      goto LAB_0010cf25;
    }
    if (local_20 <= ((Hdr *)(in_RDI->super_RefCount).m_freeFunc)->m_bufferSize) {
      if (*(ulong *)&(in_RDI->super_RefCount).m_refCount < local_18) {
        SimpleArrayDetails<unsigned_long>::ZeroConstruct::operator()
                  ((ZeroConstruct *)in_RDI,in_stack_ffffffffffffff88,0x10ccd1);
      }
      else {
        SimpleArrayDetails<unsigned_long>::destruct
                  ((unsigned_long *)((in_RDI->super_RefCount)._vptr_RefCount + local_18),
                   *(size_t *)&(in_RDI->super_RefCount).m_refCount - local_18);
      }
      SimpleArrayDetails<unsigned_long>::setHdrCount
                ((Hdr *)(in_RDI->super_RefCount).m_freeFunc,local_18);
      *(ulong *)&(in_RDI->super_RefCount).m_refCount = local_18;
      bVar5 = 1;
      goto LAB_0010cf25;
    }
  }
  if (local_18 == 0) {
    ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::release
              ((ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)in_RDI);
    bVar5 = 1;
  }
  else if (*(size_t *)&(in_RDI->super_RefCount).m_refCount == 0) {
    local_22 = reserve((Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(size_t)pBVar3)
    ;
    if ((bool)local_22) {
      SimpleArrayDetails<unsigned_long>::ZeroConstruct::operator()
                ((ZeroConstruct *)in_RDI,in_stack_ffffffffffffff88,0x10cd87);
      SimpleArrayDetails<unsigned_long>::setHdrCount
                ((Hdr *)(in_RDI->super_RefCount).m_freeFunc,local_18);
      *(ulong *)&(in_RDI->super_RefCount).m_refCount = local_18;
      bVar5 = 1;
    }
    else {
      bVar5 = 0;
    }
  }
  else {
    local_30 = getAllocSize(0x10cdbc);
    pBVar3 = (BufHdr *)mem::allocate(0x10cdcf);
    rc::BufHdr::BufHdr(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,(uintptr_t)in_RDI
                      );
    rc::primeRefCount<axl::rc::BufHdr>(in_RDI,(FreeFunc *)pBVar3);
    rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>((Ptr<axl::rc::BufHdr> *)in_RDI,pBVar3);
    pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
    if (pBVar4 == (BufHdr *)0x0) {
      bVar5 = 0;
    }
    else {
      pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
      SimpleArrayDetails<unsigned_long>::setHdrCount(pBVar4,local_18);
      pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
      uVar1._0_4_ = (in_RDI->super_RefCount).m_refCount;
      uVar1._4_4_ = (in_RDI->super_RefCount).m_weakRefCount;
      if (uVar1 < local_18) {
        SimpleArrayDetails<unsigned_long>::constructCopy
                  ((unsigned_long *)in_RDI,(unsigned_long *)pBVar3,0x10ce8c);
        SimpleArrayDetails<unsigned_long>::ZeroConstruct::operator()
                  ((ZeroConstruct *)in_RDI,(unsigned_long *)pBVar3,0x10ceb0);
      }
      else {
        SimpleArrayDetails<unsigned_long>::constructCopy
                  ((unsigned_long *)in_RDI,(unsigned_long *)pBVar3,0x10ce74);
      }
      rc::RefCount::release(&in_RDI->super_RefCount);
      (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)(pBVar4 + 1);
      pBVar3 = rc::Ptr<axl::rc::BufHdr>::detach
                         ((Ptr<axl::rc::BufHdr> *)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98);
      (in_RDI->super_RefCount).m_freeFunc = (FreeFunc *)pBVar3;
      (in_RDI->super_RefCount).m_refCount = (undefined4)local_18;
      (in_RDI->super_RefCount).m_weakRefCount = local_18._4_4_;
      bVar5 = 1;
    }
    rc::Ptr<axl::rc::BufHdr>::~Ptr((Ptr<axl::rc::BufHdr> *)0x10cf25);
  }
LAB_0010cf25:
  return (bool)(bVar5 & 1);
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}